

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_memory_filled_with
                  (char *file,wchar_t line,void *_v1,char *vd,size_t l,char *ld,char b,char *bd,
                  void *extra)

{
  ulong local_58;
  size_t i;
  size_t c;
  char *v1;
  char *ld_local;
  size_t l_local;
  char *vd_local;
  void *_v1_local;
  wchar_t line_local;
  char *file_local;
  
  i = 0;
  assertion_count(file,line);
  for (local_58 = 0; local_58 < l; local_58 = local_58 + 1) {
    if (*(char *)((long)_v1 + local_58) == b) {
      i = i + 1;
    }
  }
  if (i != l) {
    failure_start(file,line,"%s (size %d) not filled with %s",vd,l & 0xffffffff,bd);
    logprintf("   Only %d bytes were correct\n",i & 0xffffffff);
    failure_finish(extra);
  }
  file_local._4_4_ = (wchar_t)(i == l);
  return file_local._4_4_;
}

Assistant:

int
assertion_memory_filled_with(const char *file, int line,
    const void *_v1, const char *vd,
    size_t l, const char *ld,
    char b, const char *bd, void *extra)
{
	const char *v1 = (const char *)_v1;
	size_t c = 0;
	size_t i;
	(void)ld; /* UNUSED */

	assertion_count(file, line);

	for (i = 0; i < l; ++i) {
		if (v1[i] == b) {
			++c;
		}
	}
	if (c == l)
		return (1);

	failure_start(file, line, "%s (size %d) not filled with %s", vd, (int)l, bd);
	logprintf("   Only %d bytes were correct\n", (int)c);
	failure_finish(extra);
	return (0);
}